

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O0

MXFReader * __thiscall
AS_02::TimedText::MXFReader::ReadTimedTextResource
          (MXFReader *this,FrameBuffer *FrameBuf,AESDecContext *Ctx,HMACContext *HMAC)

{
  h__Reader *phVar1;
  ulong uVar2;
  HMACContext *HMAC_local;
  AESDecContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  MXFReader *this_local;
  
  phVar1 = ASDCP::mem_ptr::operator_cast_to_h__Reader_((mem_ptr *)&FrameBuf->field_0x8);
  if (phVar1 != (h__Reader *)0x0) {
    phVar1 = ASDCP::mem_ptr<AS_02::TimedText::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::TimedText::MXFReader::h__Reader> *)&FrameBuf->field_0x8);
    uVar2 = (**(code **)(*(long *)(phVar1->super_h__AS02Reader).
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>
                                  .m_File + 0x40))();
    if ((uVar2 & 1) != 0) {
      phVar1 = ASDCP::mem_ptr<AS_02::TimedText::MXFReader::h__Reader>::operator->
                         ((mem_ptr<AS_02::TimedText::MXFReader::h__Reader> *)&FrameBuf->field_0x8);
      h__Reader::ReadTimedTextResource((h__Reader *)this,(FrameBuffer *)phVar1,Ctx,HMAC);
      return this;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFReader::ReadTimedTextResource(ASDCP::TimedText::FrameBuffer& FrameBuf,
						   AESDecContext* Ctx, HMACContext* HMAC) const
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    return m_Reader->ReadTimedTextResource(FrameBuf, Ctx, HMAC);

  return RESULT_INIT;
}